

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

double * __thiscall data_structures::Matrix<double>::at(Matrix<double> *this,size_t row,size_t col)

{
  out_of_range *poVar1;
  reference pvVar2;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_6d;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  unsigned_long local_20;
  size_t col_local;
  size_t row_local;
  Matrix<double> *this_local;
  
  local_20 = col;
  col_local = row;
  row_local = (size_t)this;
  if (this->columns_ <= col) {
    local_6d = 1;
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_60,local_20);
    std::operator+(&local_40,"Matrix<ElementType>::at() : col is out of range, col accessed = ",
                   &local_60);
    std::out_of_range::out_of_range(poVar1,(string *)&local_40);
    local_6d = 0;
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (row < this->rows_) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->data_,row * this->columns_ + col);
    return pvVar2;
  }
  poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_b0,col_local);
  std::operator+(&local_90,"Matrix<ElementType>::at() : row is out of range, row accessed = ",
                 &local_b0);
  std::out_of_range::out_of_range(poVar1,(string *)&local_90);
  __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

ElementType& Matrix<ElementType>::at(size_t row, size_t col) {
  // NOTE: Using at() for checking bounds.
  // TODO: There is a max original x-coordinate that can be addressed - maybe
  //       should be verified here.
  if (col >= columns_ || col < 0) {
    throw std::out_of_range ("Matrix<ElementType>::at() : col is out of range, col accessed = " + std::to_string(col));
  }
  if (row >= rows_) {
    throw std::out_of_range ("Matrix<ElementType>::at() : row is out of range, row accessed = " + std::to_string(row));
  }
  return data_[row * columns_ + col];
}